

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O2

void __thiscall Fluid::draw_grid(Fluid *this,mat4 *projection,mat4 *view,int display_mode)

{
  PFNGLUNIFORM1IPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORM3IVPROC p_Var3;
  PFNGLUNIFORMMATRIX4FVPROC p_Var4;
  GLint GVar5;
  socklen_t __len;
  sockaddr *__addr;
  int __fd;
  allocator<char> local_f5;
  int local_f4;
  GLchar *local_f0 [4];
  GLchar *local_d0 [4];
  GLchar *local_b0 [4];
  GLchar *local_90 [4];
  GLchar *local_70 [4];
  GLchar *local_50 [4];
  
  local_f4 = display_mode;
  gfx::Program::use(&this->grid_program);
  p_Var2 = glad_glUniform3fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"bounds_min",&local_f5);
  GVar5 = (*glad_glGetUniformLocation)((this->grid_program).id,local_50[0]);
  (*p_Var2)(GVar5,1,(GLfloat *)&this->bounds_min);
  std::__cxx11::string::~string((string *)local_50);
  p_Var2 = glad_glUniform3fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"bounds_max",&local_f5);
  GVar5 = (*glad_glGetUniformLocation)((this->grid_program).id,local_70[0]);
  (*p_Var2)(GVar5,1,(GLfloat *)&this->bounds_max);
  std::__cxx11::string::~string((string *)local_70);
  p_Var3 = glad_glUniform3iv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"grid_dim",&local_f5);
  GVar5 = (*glad_glGetUniformLocation)((this->grid_program).id,local_90[0]);
  (*p_Var3)(GVar5,1,(GLint *)&this->grid_dimensions);
  std::__cxx11::string::~string((string *)local_90);
  p_Var4 = glad_glUniformMatrix4fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"projection",&local_f5);
  GVar5 = (*glad_glGetUniformLocation)((this->grid_program).id,local_b0[0]);
  (*p_Var4)(GVar5,1,'\0',(GLfloat *)projection);
  std::__cxx11::string::~string((string *)local_b0);
  p_Var4 = glad_glUniformMatrix4fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,"view",&local_f5);
  GVar5 = (*glad_glGetUniformLocation)((this->grid_program).id,local_d0[0]);
  (*p_Var4)(GVar5,1,'\0',(GLfloat *)view);
  __len = (socklen_t)view;
  std::__cxx11::string::~string((string *)local_d0);
  p_Var1 = glad_glUniform1i;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,"display_mode",&local_f5);
  GVar5 = (*glad_glGetUniformLocation)((this->grid_program).id,local_f0[0]);
  __fd = local_f4;
  (*p_Var1)(GVar5,local_f4);
  std::__cxx11::string::~string((string *)local_f0);
  gfx::VAO::bind(&this->grid_vao,__fd,__addr,__len);
  (*glad_glPointSize)(16.0);
  (*glad_glDrawArrays)(0,0,(this->grid_ssbo)._length);
  gfx::VAO::unbind(&this->grid_vao);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void draw_grid(const glm::mat4& projection, const glm::mat4& view, int display_mode) {
        grid_program.use();
        glUniform3fv(grid_program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(grid_program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(grid_program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        glUniformMatrix4fv(grid_program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
        glUniformMatrix4fv(grid_program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
        glUniform1i(grid_program.uniform_loc("display_mode"), display_mode);
        grid_vao.bind();
        glPointSize(16.0);
        glDrawArrays(GL_POINTS, 0, grid_ssbo.length());
        grid_vao.unbind();
        grid_program.disuse();
    }